

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall
QFileDialogPrivate::itemNotFound(QFileDialogPrivate *this,QString *fileName,FileMode mode)

{
  QFileDialog *text;
  int in_EDX;
  undefined8 in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialog *q;
  QString message;
  undefined8 in_stack_ffffffffffffff58;
  int n;
  StandardButton flags;
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uVar1;
  QWidget *parent;
  QString *a;
  QFlagsStorage<QMessageBox::StandardButton> buttons;
  QChar in_stack_ffffffffffffffae;
  undefined1 local_50 [48];
  QString local_20;
  long local_8;
  
  flags = (StandardButton)((ulong)in_RSI >> 0x20);
  n = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  text = q_func(in_RDI);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  if (in_EDX == 2) {
    QFileDialog::tr((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                    in_stack_ffffffffffffff60,n);
  }
  else {
    QFileDialog::tr((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                    in_stack_ffffffffffffff60,n);
  }
  a = (QString *)(local_50 + 0x18);
  QWidget::windowTitle((QWidget *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffae,L' ');
  parent = (QWidget *)local_50;
  uVar1 = 0;
  QString::arg<QString,_true>(&local_20,a,(int)((ulong)parent >> 0x20),in_stack_ffffffffffffffae);
  buttons.i = (Int)((ulong)a >> 0x20);
  QFlags<QMessageBox::StandardButton>::QFlags((QFlags<QMessageBox::StandardButton> *)text,flags);
  QMessageBox::warning
            (parent,(QString *)CONCAT44(uVar1,in_stack_ffffffffffffff68),(QString *)text,
             (StandardButtons)buttons.i,flags);
  QString::~QString((QString *)0x75bd5c);
  QString::~QString((QString *)0x75bd66);
  QString::~QString((QString *)0x75bd70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::itemNotFound(const QString &fileName, QFileDialog::FileMode mode)
{
#if QT_CONFIG(messagebox)
    Q_Q(QFileDialog);
    const QString message = mode == QFileDialog::Directory
            ? QFileDialog::tr("%1\nDirectory not found.\n"
                              "Please verify the correct directory name was given.")
            : QFileDialog::tr("%1\nFile not found.\nPlease verify the "
                              "correct file name was given.");

    QMessageBox::warning(q, q->windowTitle(), message.arg(fileName));
#endif // QT_CONFIG(messagebox)
}